

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall V1Transport::readData(V1Transport *this,Span<const_unsigned_char> msg_bytes)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->hdr).nMessageSize;
  uVar4 = uVar1 - this->nDataPos;
  if ((uint)msg_bytes.m_size <= uVar4) {
    uVar4 = (uint)msg_bytes.m_size;
  }
  uVar3 = this->nDataPos + uVar4;
  if ((ulong)((long)(this->vRecv).vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)((this->vRecv).vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start + (this->vRecv).m_read_pos)) < (ulong)uVar3) {
    uVar3 = uVar3 + 0x40000;
    if (uVar1 <= uVar3) {
      uVar3 = uVar1;
    }
    DataStream::resize(&this->vRecv,(ulong)uVar3,0);
  }
  CSHA256::Write(&(this->hasher).sha,msg_bytes.m_data,(ulong)uVar4);
  memcpy((this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
         _M_impl.super__Vector_impl_data._M_start + (ulong)this->nDataPos + (this->vRecv).m_read_pos
         ,msg_bytes.m_data,(ulong)uVar4);
  this->nDataPos = this->nDataPos + uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int V1Transport::readData(Span<const uint8_t> msg_bytes)
{
    AssertLockHeld(m_recv_mutex);
    unsigned int nRemaining = hdr.nMessageSize - nDataPos;
    unsigned int nCopy = std::min<unsigned int>(nRemaining, msg_bytes.size());

    if (vRecv.size() < nDataPos + nCopy) {
        // Allocate up to 256 KiB ahead, but never more than the total message size.
        vRecv.resize(std::min(hdr.nMessageSize, nDataPos + nCopy + 256 * 1024));
    }

    hasher.Write(msg_bytes.first(nCopy));
    memcpy(&vRecv[nDataPos], msg_bytes.data(), nCopy);
    nDataPos += nCopy;

    return nCopy;
}